

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int fits_hdecompress64(uchar *input,int smooth,LONGLONG *a,int *ny,int *nx,int *scale,int *status)

{
  int iVar1;
  int iVar2;
  int local_54;
  int nval;
  int ii;
  int *iarray;
  int stat;
  int *scale_local;
  int *nx_local;
  int *ny_local;
  LONGLONG *a_local;
  int smooth_local;
  uchar *input_local;
  
  if (*status < 1) {
    iVar2 = decode64(input,a,nx,ny,scale);
    *status = iVar2;
    if (iVar2 == 0) {
      undigitize64(a,*nx,*ny,*scale);
      iVar2 = hinv64(a,*nx,*ny,smooth,*scale);
      *status = iVar2;
      iVar2 = *nx;
      iVar1 = *ny;
      for (local_54 = 0; local_54 < iVar2 * iVar1; local_54 = local_54 + 1) {
        *(int *)((long)a + (long)local_54 * 4) = (int)a[local_54];
      }
      input_local._4_4_ = *status;
    }
    else {
      input_local._4_4_ = *status;
    }
  }
  else {
    input_local._4_4_ = *status;
  }
  return input_local._4_4_;
}

Assistant:

int fits_hdecompress64(unsigned char *input, int smooth, LONGLONG *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
  int stat, *iarray, ii, nval;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode64(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize64(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv64(a, *nx, *ny, smooth, *scale);

        *status = stat;
	
         /* pack the I*8 values back into an I*4 array */
        iarray = (int *) a;
	nval = (*nx) * (*ny);

	for (ii = 0; ii < nval; ii++)
	   iarray[ii] = (int) a[ii];	

  return(*status);
}